

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes LzmaDec_DecodeToDic(CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,
                        ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  uint uVar2;
  UInt16 *pUVar3;
  ELzmaDummy EVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  Byte *bufLimit;
  SizeT inSize;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  inSize = *srcLen;
  *srcLen = 0;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  buf = p->tempBuf;
  do {
    uVar11 = p->remainLen;
    if (uVar11 == 0x112) {
      uVar11 = 1;
      if (p->code == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
        uVar11 = (uint)(p->code != 0);
      }
      return uVar11;
    }
    if (p->needFlush != 0) {
      uVar2 = p->tempBufSize;
      lVar6 = 0;
      while( true ) {
        uVar8 = uVar2 + (int)lVar6;
        if (inSize - lVar6 == 0) break;
        if (4 < uVar8) goto LAB_001116a3;
        BVar1 = src[lVar6];
        p->tempBufSize = uVar2 + (int)lVar6 + 1;
        buf[lVar6 + (ulong)uVar2] = BVar1;
        *srcLen = *srcLen + 1;
        lVar6 = lVar6 + 1;
      }
      if (uVar8 < 5) goto LAB_001118ed;
LAB_001116a3:
      if (*buf != '\0') {
        return 1;
      }
      uVar2 = *(uint *)(p->tempBuf + 1);
      p->code = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      p->range = 0xffffffff;
      p->needFlush = 0;
      src = src + lVar6;
      p->tempBufSize = 0;
      inSize = inSize - lVar6;
    }
    uVar10 = p->dicPos;
    if (dicLimit <= uVar10) {
      if (uVar11 != 0) {
        if (finishMode == LZMA_FINISH_ANY) {
LAB_001118b3:
          *status = LZMA_STATUS_NOT_FINISHED;
          return 0;
        }
        goto LAB_001118a3;
      }
      if (p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return 0;
      }
      if (finishMode == LZMA_FINISH_ANY) goto LAB_001118b3;
    }
    if (p->needInitState != 0) {
      uVar11 = (p->prop).lp;
      uVar2 = (p->prop).lc;
      pUVar3 = p->probs;
      for (uVar7 = 0; (0x300 << ((char)uVar11 + (char)uVar2 & 0x1fU)) + 0x736 != uVar7;
          uVar7 = uVar7 + 1) {
        pUVar3[uVar7] = 0x400;
      }
      p->reps[3] = 1;
      p->state = 0;
      p->reps[0] = 1;
      p->reps[1] = 1;
      p->reps[2] = 1;
      p->needInitState = 0;
    }
    uVar7 = (ulong)p->tempBufSize;
    if (uVar7 == 0) {
      if (inSize < 0x14 || dicLimit <= uVar10) {
        EVar4 = LzmaDec_TryDummy(p,src,inSize);
        if (EVar4 == DUMMY_ERROR) {
          memcpy(buf,src,inSize);
          p->tempBufSize = (uint)inSize;
          *srcLen = *srcLen + inSize;
LAB_001118ed:
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return 0;
        }
        bufLimit = src;
        if ((dicLimit <= uVar10) && (EVar4 != DUMMY_MATCH)) {
LAB_001118a3:
          *status = LZMA_STATUS_NOT_FINISHED;
          return 1;
        }
      }
      else {
        bufLimit = src + (inSize - 0x14);
      }
      p->buf = src;
      iVar5 = LzmaDec_DecodeReal2(p,dicLimit,bufLimit);
      if (iVar5 != 0) {
        return 1;
      }
      uVar10 = (long)p->buf - (long)src;
      *srcLen = *srcLen + uVar10;
    }
    else {
      for (uVar9 = 0; (uVar7 < 0x14 && (uVar9 < inSize)); uVar9 = uVar9 + 1) {
        buf[uVar7] = src[uVar9];
        uVar7 = uVar7 + 1;
      }
      uVar11 = (uint)uVar7;
      p->tempBufSize = uVar11;
      if (dicLimit <= uVar10 || uVar7 < 0x14) {
        EVar4 = LzmaDec_TryDummy(p,buf,uVar7);
        if (EVar4 == DUMMY_ERROR) {
          *srcLen = *srcLen + uVar9;
          goto LAB_001118ed;
        }
        if ((dicLimit <= uVar10) && (EVar4 != DUMMY_MATCH)) goto LAB_001118a3;
      }
      p->buf = buf;
      iVar5 = LzmaDec_DecodeReal2(p,dicLimit,buf);
      if (iVar5 != 0) {
        return 1;
      }
      iVar5 = (int)p->buf;
      if (uVar11 < (uint)(iVar5 - (int)buf)) {
        return 0xb;
      }
      uVar11 = (uVar11 + (int)p + 0x70) - iVar5;
      if ((uint)uVar9 < uVar11) {
        return 0xb;
      }
      uVar10 = (ulong)((uint)uVar9 - uVar11);
      *srcLen = *srcLen + uVar10;
      p->tempBufSize = 0;
    }
    src = src + uVar10;
    inSize = inSize - uVar10;
  } while( true );
}

Assistant:

static SRes LzmaDec_DecodeToDic(CLzmaDec *p, SizeT dicLimit, const Byte *src, SizeT *srcLen,
    ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);
  
  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart)
  {
      int checkEndMarkNow;

      if (p->needFlush)
      {
        for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
          p->tempBuf[p->tempBufSize++] = *src++;
        if (p->tempBufSize < RC_INIT_SIZE)
        {
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (p->tempBuf[0] != 0)
          return SZ_ERROR_DATA;
        p->code =
              ((UInt32)p->tempBuf[1] << 24)
            | ((UInt32)p->tempBuf[2] << 16)
            | ((UInt32)p->tempBuf[3] << 8)
            | ((UInt32)p->tempBuf[4]);
        p->range = 0xFFFFFFFF;
        p->needFlush = 0;
        p->tempBufSize = 0;
      }

      checkEndMarkNow = 0;
      if (p->dicPos >= dicLimit)
      {
        if (p->remainLen == 0 && p->code == 0)
        {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
          return SZ_OK;
        }
        if (finishMode == LZMA_FINISH_ANY)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_OK;
        }
        if (p->remainLen != 0)
        {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        checkEndMarkNow = 1;
      }

      if (p->needInitState)
        LzmaDec_InitStateReal(p);
  
      if (p->tempBufSize == 0)
      {
        SizeT processed;
        const Byte *bufLimit;
        if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, src, inSize);
          if (dummyRes == DUMMY_ERROR)
          {
            memcpy(p->tempBuf, src, inSize);
            p->tempBufSize = (unsigned)inSize;
            (*srcLen) += inSize;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
          bufLimit = src;
        }
        else
          bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
        p->buf = src;
        if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
          return SZ_ERROR_DATA;
        processed = (SizeT)(p->buf - src);
        (*srcLen) += processed;
        src += processed;
        inSize -= processed;
      }
      else
      {
        unsigned rem = p->tempBufSize, lookAhead = 0;
        while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
          p->tempBuf[rem++] = src[lookAhead++];
        p->tempBufSize = rem;
        if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow)
        {
          int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
          if (dummyRes == DUMMY_ERROR)
          {
            (*srcLen) += lookAhead;
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return SZ_OK;
          }
          if (checkEndMarkNow && dummyRes != DUMMY_MATCH)
          {
            *status = LZMA_STATUS_NOT_FINISHED;
            return SZ_ERROR_DATA;
          }
        }
        p->buf = p->tempBuf;
        if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
          return SZ_ERROR_DATA;
        
        {
          unsigned kkk = (unsigned)(p->buf - p->tempBuf);
          if (rem < kkk)
            return SZ_ERROR_FAIL; /* some internal error */
          rem -= kkk;
          if (lookAhead < rem)
            return SZ_ERROR_FAIL; /* some internal error */
          lookAhead -= rem;
        }
        (*srcLen) += lookAhead;
        src += lookAhead;
        inSize -= lookAhead;
        p->tempBufSize = 0;
      }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}